

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Reverb::reset(V2Reverb *this)

{
  long lVar1;
  undefined1 *puVar2;
  long lVar3;
  float (*pafVar4) [4];
  undefined1 *puVar5;
  
  pafVar4 = this->combl;
  puVar5 = &this->field_0x30;
  puVar2 = &this->field_0xd0;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
      memset(*(void **)(puVar5 + lVar1 * 4),0,(ulong)*(uint *)(puVar5 + lVar1 * 4 + -4) << 2);
      *(undefined4 *)(puVar5 + lVar1 * 4 + -8) = 0;
      *(undefined4 *)((long)*pafVar4 + lVar1) = 0;
    }
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 0x10) {
      memset(*(void **)(puVar2 + lVar1),0,(ulong)*(uint *)(puVar2 + lVar1 + -4) << 2);
      *(undefined4 *)(puVar2 + lVar1 + -8) = 0;
    }
    this->hpf[lVar3] = 0.0;
    puVar5 = puVar5 + 0x40;
    pafVar4 = pafVar4 + 1;
    puVar2 = puVar2 + 0x20;
  }
  return;
}

Assistant:

void reset()
    {
        for (int ch=0; ch < 2; ch++)
        {
            // comb
            for (int i=0; i < 4; i++)
            {
                combd[ch][i].reset();
                combl[ch][i] = 0.0f;
            }

            // allpass
            for (int i=0; i < 2; i++)
                alld[ch][i].reset();

            // low cut
            hpf[ch] = 0.0f;
        }
    }